

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

ALLEGRO_SYSTEM * find_system(_AL_VECTOR *vector)

{
  long *plVar1;
  ALLEGRO_SYSTEM *pAVar2;
  _AL_VECTOR *in_RDI;
  uint i;
  ALLEGRO_SYSTEM *system;
  ALLEGRO_SYSTEM_INTERFACE *sys_interface;
  ALLEGRO_SYSTEM_INTERFACE **sptr;
  uint local_2c;
  
  local_2c = 0;
  while( true ) {
    if (in_RDI->_size <= (ulong)local_2c) {
      return (ALLEGRO_SYSTEM *)0x0;
    }
    plVar1 = (long *)_al_vector_ref(in_RDI,local_2c);
    pAVar2 = (ALLEGRO_SYSTEM *)(**(code **)(*plVar1 + 8))(0);
    if (pAVar2 != (ALLEGRO_SYSTEM *)0x0) break;
    local_2c = local_2c + 1;
  }
  return pAVar2;
}

Assistant:

static ALLEGRO_SYSTEM *find_system(_AL_VECTOR *vector)
{
   ALLEGRO_SYSTEM_INTERFACE **sptr;
   ALLEGRO_SYSTEM_INTERFACE *sys_interface;
   ALLEGRO_SYSTEM *system;
   unsigned int i;

   for (i = 0; i < vector->_size; i++) {
      sptr = _al_vector_ref(vector, i);
      sys_interface = *sptr;
      if ((system = sys_interface->initialize(0)) != NULL)
         return system;
   }

   return NULL;
}